

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O2

URegistryKey __thiscall
icu_63::ICUService::registerInstance
          (ICUService *this,UObject *objToAdopt,UnicodeString *id,UBool visible,UErrorCode *status)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_01;
  UnicodeString canonicalID;
  UnicodeString local_68;
  long *plVar2;
  undefined4 extraout_var_00;
  
  iVar1 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xd])(this,id,status);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 != (long *)0x0) {
    local_68.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b1268;
    local_68.fUnion.fStackFields.fLengthAndFlags = 2;
    (**(code **)(*plVar2 + 0x20))(plVar2);
    (**(code **)(*plVar2 + 8))(plVar2);
    iVar1 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xf])
                      (this,objToAdopt,&local_68,(ulong)(uint)(int)visible,status);
    lVar3 = CONCAT44(extraout_var_00,iVar1);
    if (lVar3 != 0) {
      iVar1 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[9])(this,lVar3,status);
      status = (UErrorCode *)CONCAT44(extraout_var_01,iVar1);
    }
    UnicodeString::~UnicodeString(&local_68);
    if (lVar3 != 0) {
      return status;
    }
  }
  if (objToAdopt != (UObject *)0x0) {
    (*objToAdopt->_vptr_UObject[1])(objToAdopt);
  }
  return (URegistryKey)0x0;
}

Assistant:

URegistryKey
ICUService::registerInstance(UObject* objToAdopt, const UnicodeString& id, UBool visible, UErrorCode& status) 
{
    ICUServiceKey* key = createKey(&id, status);
    if (key != NULL) {
        UnicodeString canonicalID;
        key->canonicalID(canonicalID);
        delete key;

        ICUServiceFactory* f = createSimpleFactory(objToAdopt, canonicalID, visible, status);
        if (f != NULL) {
            return registerFactory(f, status);
        }
    }
    delete objToAdopt;
    return NULL;
}